

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

bool __thiscall luna::BarrieredMarkVisitor::VisitObj(BarrieredMarkVisitor *this,GCObject *obj)

{
  GCObject *obj_local;
  BarrieredMarkVisitor *this_local;
  bool local_1;
  
  if (((obj->field_0x10 & 3) == 0) || (((byte)obj->field_0x10 >> 2 & 3) != 1)) {
    if (((obj->field_0x10 & 3) == 0) && (((byte)obj->field_0x10 >> 2 & 3) == 0)) {
      obj->field_0x10 = obj->field_0x10 & 0xf3 | 4;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    obj->field_0x10 = obj->field_0x10 & 0xf3;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool VisitObj(GCObject *obj)
        {
            // Visit member GC objects of obj when it is barriered object
            if (obj->generation_ != GCGen0 && obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                return true;
            }

            // Visit GCGen0 generation object
            if (obj->generation_ == GCGen0 && obj->gc_ == GCFlag_White)
            {
                obj->gc_ = GCFlag_Black;
                return true;
            }
            return false;
        }